

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O2

void __thiscall DatalogDatabase::dump_rules(DatalogDatabase *this,ostream *out)

{
  pointer ppRVar1;
  ostream *poVar2;
  ulong uVar3;
  string local_48;
  
  for (uVar3 = 0;
      ppRVar1 = (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3);
      uVar3 = uVar3 + 1) {
    Rule::toString_abi_cxx11_(&local_48,ppRVar1[uVar3]);
    poVar2 = std::operator<<(out,(string *)&local_48);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void DatalogDatabase::dump_rules(ostream& out)
{
  for (size_t k = 0; k < rules.size(); k++)
  {
    out << rules[k]->toString() << endl << endl;
  }
}